

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

bool __thiscall
metaf::VisibilityGroup::appendVariableMaxFraction
          (VisibilityGroup *this,string *group,IncompleteText next)

{
  char cVar1;
  Modifier MVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  Modifier MVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  _Optional_payload_base<unsigned_int> _Var11;
  ulong uVar12;
  Unit UVar13;
  long lVar14;
  ulong uVar15;
  
  uVar9 = group->_M_string_length;
  bVar3 = false;
  uVar5 = std::__cxx11::string::find((char)group,0x2f);
  if (0xfffffffffffffffd < uVar5 - 3) {
    uVar8 = uVar9 - (uVar5 + 1);
    if (uVar8 < 3 && uVar9 != uVar5 + 1) {
      uVar15 = group->_M_string_length;
      uVar12 = 0;
      if (uVar5 <= uVar15 && uVar15 != 0) {
        lVar14 = 0;
        do {
          cVar1 = (group->_M_dataplus)._M_p[lVar14];
          if ((byte)(cVar1 - 0x3aU) < 0xf6) {
            uVar7 = 0;
            uVar12 = 0;
            goto LAB_001a9136;
          }
          uVar7 = (uint)(byte)(cVar1 - 0x30) + (int)uVar12 * 10;
          uVar12 = (ulong)uVar7;
          lVar14 = lVar14 + 1;
        } while ((uint)lVar14 < (uint)uVar5);
        uVar12 = 0x100000000;
LAB_001a9136:
        uVar12 = uVar7 | uVar12;
      }
      uVar10 = 0;
      if (uVar9 <= uVar15 && uVar15 != 0) {
        uVar9 = 1;
        do {
          cVar1 = (group->_M_dataplus)._M_p[uVar9 + uVar5];
          if ((byte)(cVar1 - 0x3aU) < 0xf6) {
            uVar7 = 0;
            uVar5 = 0;
            goto LAB_001a918c;
          }
          uVar7 = (uint)(byte)(cVar1 - 0x30) + (int)uVar10 * 10;
          uVar10 = (ulong)uVar7;
          uVar15 = uVar9 & 0xffffffff;
          uVar9 = uVar9 + 1;
        } while (uVar15 < uVar8);
        uVar5 = 0x100000000;
LAB_001a918c:
        uVar10 = uVar7 | uVar5;
      }
      bVar3 = false;
      if (((uVar12 & 0x100000000) != 0) && ((uVar10 & 0x100000000) != 0)) {
        uVar5 = uVar12 & 0xffffffff | uVar10 << 0x20;
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    return false;
  }
  uVar9 = uVar5 >> 0x20;
  if (uVar9 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)((int)uVar5 * 10000) / uVar9 | 0x100000000;
  }
  if ((uVar5 & 0x100000000) == 0) {
    return false;
  }
  MVar2 = (this->visMax).distModifier;
  if ((MVar2 < DISTANT) && (uVar9 != 0)) {
    _Var11._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var11._M_engaged = false;
    _Var11._5_3_ = 0;
    UVar13 = METERS;
    bVar3 = false;
    MVar6 = NONE;
    if ((this->visMax).distUnit != STATUTE_MILES) goto LAB_001a9111;
    if ((((this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
        (uVar7 = (this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload._M_value,
        (uVar7 * 0x3afb7e91 >> 4 | uVar7 * 0x10000000) < 0x68db9)) &&
       (iVar4 = (int)uVar5, 0x68db8 < ((uint)(iVar4 * 0x3afb7e91) >> 4 | iVar4 * 0x10000000))) {
      _Var11 = (_Optional_payload_base<unsigned_int>)((ulong)(uVar7 + iVar4) | 0x100000000);
      bVar3 = true;
      UVar13 = STATUTE_MILES;
      MVar6 = MVar2;
      goto LAB_001a9111;
    }
  }
  _Var11._M_payload = (_Storage<unsigned_int,_true>)0x0;
  _Var11._M_engaged = false;
  _Var11._5_3_ = 0;
  UVar13 = METERS;
  bVar3 = false;
  MVar6 = NONE;
LAB_001a9111:
  if (bVar3) {
    (this->visMax).distModifier = MVar6;
    (this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> = _Var11;
    (this->visMax).distUnit = UVar13;
    this->incompleteText = next;
  }
  return bVar3;
}

Assistant:

bool VisibilityGroup::appendVariableMaxFraction(const std::string & group, IncompleteText next) {
	const auto fraction = fractionStrToUint(group, 0, group.length());
	if (!fraction.has_value()) return false;
	const auto numerator = std::get<0>(*fraction);
	const auto denominator = std::get<1>(*fraction);
	const auto v = Distance(numerator, denominator);
	if (!v.isValue()) return false;
	const auto t = Distance::fromIntegerAndFraction(visMax, v);
	if (!t.has_value()) return false;
	visMax = *t;
	incompleteText = next;
	return true;
}